

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O0

int greatest_prng_init_second_pass(int id,unsigned_long seed)

{
  ulong local_28;
  greatest_prng *p;
  unsigned_long seed_local;
  int id_local;
  
  if (greatest_info.prng[id].count == 0) {
    seed_local._4_4_ = 0;
  }
  else {
    greatest_info.prng[id].count_ceil = greatest_info.prng[id].count;
    greatest_info.prng[id].m = 1;
    while (greatest_info.prng[id].m < greatest_info.prng[id].count) {
      greatest_info.prng[id].m = greatest_info.prng[id].m << 1;
    }
    greatest_info.prng[id].state = seed & 0x1fffffff;
    greatest_info.prng[id].a = greatest_info.prng[id].state << 2;
    if (greatest_info.prng[id].a == 0) {
      local_28 = 4;
    }
    else {
      local_28 = greatest_info.prng[id].a;
    }
    greatest_info.prng[id].a = local_28 | 1;
    greatest_info.prng[id].c = 0x7fffffff;
    greatest_info.prng[id].initialized = '\x01';
    fprintf(_stderr,"init_second_pass: a %lu, c %lu, state %lu\n",greatest_info.prng[id].a,
            greatest_info.prng[id].c,greatest_info.prng[id].state);
    seed_local._4_4_ = 1;
  }
  return seed_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}